

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  char **extraout_RDX_07;
  char **extraout_RDX_08;
  char **extraout_RDX_09;
  char **extraout_RDX_10;
  char **extraout_RDX_11;
  char **extraout_RDX_12;
  char **extraout_RDX_13;
  char **extraout_RDX_14;
  char **extraout_RDX_15;
  char **extraout_RDX_16;
  char **extraout_RDX_17;
  char **extraout_RDX_18;
  char **extraout_RDX_19;
  char **extraout_RDX_20;
  char **extraout_RDX_21;
  long lVar3;
  _Alloc_hider _Var4;
  int iVar5;
  string arg_string;
  string local_50;
  
  _Var4._M_p = (pointer)argc;
  if (1 < *argc) {
    iVar5 = 1;
    do {
      StreamableToString<char*>(&local_50,(internal *)(argv + iVar5),in_RDX);
      _Var4._M_p = local_50._M_dataplus._M_p;
      bVar1 = ParseBoolFlag(local_50._M_dataplus._M_p,"also_run_disabled_tests",
                            (bool *)&FLAGS_gtest_also_run_disabled_tests);
      in_RDX = extraout_RDX;
      if (((((bVar1) ||
            (bVar1 = ParseBoolFlag(_Var4._M_p,"break_on_failure",
                                   (bool *)&FLAGS_gtest_break_on_failure), in_RDX = extraout_RDX_00,
            bVar1)) ||
           (bVar1 = ParseBoolFlag(_Var4._M_p,"catch_exceptions",
                                  (bool *)&FLAGS_gtest_catch_exceptions), in_RDX = extraout_RDX_01,
           bVar1)) ||
          (((bVar1 = ParseStringFlag(_Var4._M_p,"color",(string *)&FLAGS_gtest_color_abi_cxx11_),
            in_RDX = extraout_RDX_02, bVar1 ||
            (bVar1 = ParseStringFlag(_Var4._M_p,"death_test_style",
                                     (string *)FLAGS_gtest_death_test_style_abi_cxx11_),
            in_RDX = extraout_RDX_03, bVar1)) ||
           ((bVar1 = ParseBoolFlag(_Var4._M_p,"death_test_use_fork",
                                   (bool *)&FLAGS_gtest_death_test_use_fork),
            in_RDX = extraout_RDX_04, bVar1 ||
            ((bVar1 = ParseStringFlag(_Var4._M_p,"filter",(string *)&FLAGS_gtest_filter_abi_cxx11_),
             in_RDX = extraout_RDX_05, bVar1 ||
             (bVar1 = ParseStringFlag(_Var4._M_p,"internal_run_death_test",
                                      (string *)&FLAGS_gtest_internal_run_death_test_abi_cxx11_),
             in_RDX = extraout_RDX_06, bVar1)))))))) ||
         ((bVar1 = ParseBoolFlag(_Var4._M_p,"list_tests",(bool *)&FLAGS_gtest_list_tests),
          in_RDX = extraout_RDX_07, bVar1 ||
          (((((bVar1 = ParseStringFlag(_Var4._M_p,"output",(string *)&FLAGS_gtest_output_abi_cxx11_)
              , in_RDX = extraout_RDX_08, bVar1 ||
              (bVar1 = ParseBoolFlag(_Var4._M_p,"print_time",(bool *)&FLAGS_gtest_print_time),
              in_RDX = extraout_RDX_09, bVar1)) ||
             (bVar1 = ParseInt32Flag(_Var4._M_p,"random_seed",&FLAGS_gtest_random_seed),
             in_RDX = extraout_RDX_10, bVar1)) ||
            ((bVar1 = ParseInt32Flag(_Var4._M_p,"repeat",&FLAGS_gtest_repeat),
             in_RDX = extraout_RDX_11, bVar1 ||
             (bVar1 = ParseBoolFlag(_Var4._M_p,"shuffle",(bool *)&FLAGS_gtest_shuffle),
             in_RDX = extraout_RDX_12, bVar1)))) ||
           ((bVar1 = ParseInt32Flag(_Var4._M_p,"stack_trace_depth",&FLAGS_gtest_stack_trace_depth),
            in_RDX = extraout_RDX_13, bVar1 ||
            ((bVar1 = ParseStringFlag(_Var4._M_p,"stream_result_to",
                                      (string *)&FLAGS_gtest_stream_result_to_abi_cxx11_),
             in_RDX = extraout_RDX_14, bVar1 ||
             (bVar1 = ParseBoolFlag(_Var4._M_p,"throw_on_failure",
                                    (bool *)&FLAGS_gtest_throw_on_failure), in_RDX = extraout_RDX_15
             , bVar1)))))))))) {
        iVar2 = *argc;
        if (iVar2 != iVar5) {
          in_RDX = argv + (long)iVar5 + 1;
          lVar3 = 0;
          do {
            in_RDX[lVar3 + -1] = in_RDX[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar2 - iVar5 != (int)lVar3);
        }
        *argc = iVar2 + -1;
        iVar5 = iVar5 + -1;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        in_RDX = extraout_RDX_17;
        if ((((iVar2 == 0) ||
             (iVar2 = std::__cxx11::string::compare((char *)&local_50), in_RDX = extraout_RDX_18,
             iVar2 == 0)) ||
            (iVar2 = std::__cxx11::string::compare((char *)&local_50), in_RDX = extraout_RDX_19,
            iVar2 == 0)) ||
           ((iVar2 = std::__cxx11::string::compare((char *)&local_50), in_RDX = extraout_RDX_20,
            iVar2 == 0 ||
            (bVar1 = HasGoogleTestFlagPrefix((char *)0x123f5d), in_RDX = extraout_RDX_21, bVar1))))
        {
          g_help_flag = '\x01';
        }
      }
      _Var4._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_16;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded(_Var4._M_p);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    // Do we see a Google Test flag?
    if (ParseBoolFlag(arg, kAlsoRunDisabledTestsFlag,
                      &GTEST_FLAG(also_run_disabled_tests)) ||
        ParseBoolFlag(arg, kBreakOnFailureFlag,
                      &GTEST_FLAG(break_on_failure)) ||
        ParseBoolFlag(arg, kCatchExceptionsFlag,
                      &GTEST_FLAG(catch_exceptions)) ||
        ParseStringFlag(arg, kColorFlag, &GTEST_FLAG(color)) ||
        ParseStringFlag(arg, kDeathTestStyleFlag,
                        &GTEST_FLAG(death_test_style)) ||
        ParseBoolFlag(arg, kDeathTestUseFork,
                      &GTEST_FLAG(death_test_use_fork)) ||
        ParseStringFlag(arg, kFilterFlag, &GTEST_FLAG(filter)) ||
        ParseStringFlag(arg, kInternalRunDeathTestFlag,
                        &GTEST_FLAG(internal_run_death_test)) ||
        ParseBoolFlag(arg, kListTestsFlag, &GTEST_FLAG(list_tests)) ||
        ParseStringFlag(arg, kOutputFlag, &GTEST_FLAG(output)) ||
        ParseBoolFlag(arg, kPrintTimeFlag, &GTEST_FLAG(print_time)) ||
        ParseInt32Flag(arg, kRandomSeedFlag, &GTEST_FLAG(random_seed)) ||
        ParseInt32Flag(arg, kRepeatFlag, &GTEST_FLAG(repeat)) ||
        ParseBoolFlag(arg, kShuffleFlag, &GTEST_FLAG(shuffle)) ||
        ParseInt32Flag(arg, kStackTraceDepthFlag,
                       &GTEST_FLAG(stack_trace_depth)) ||
        ParseStringFlag(arg, kStreamResultToFlag,
                        &GTEST_FLAG(stream_result_to)) ||
        ParseBoolFlag(arg, kThrowOnFailureFlag,
                      &GTEST_FLAG(throw_on_failure))
        ) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}